

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_iterator.cpp
# Opt level: O0

void __thiscall csv::CSVReader::iterator::iterator(iterator *this,CSVReader *_daddy,CSVRow *_row)

{
  CSVRow *_row_local;
  CSVReader *_daddy_local;
  iterator *this_local;
  
  this->daddy = _daddy;
  CSVRow::CSVRow(&this->row);
  this->i = 0;
  CSVRow::operator=(&this->row,_row);
  return;
}

Assistant:

CSV_INLINE CSVReader::iterator::iterator(CSVReader* _daddy, CSVRow&& _row) :
        daddy(_daddy) {
        row = std::move(_row);
    }